

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sshl_ov(APInt *this,APInt *ShAmt,bool *Overflow)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  APInt AVar4;
  undefined8 uVar3;
  
  bVar1 = uge((APInt *)Overflow,(ulong)ShAmt->BitWidth);
  *(bool *)in_RCX = bVar1;
  if (bVar1) {
    APInt(this,ShAmt->BitWidth,0,false);
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = isNonNegative(ShAmt);
    if (bVar1) {
      uVar2 = countLeadingZeros(ShAmt);
    }
    else {
      uVar2 = countLeadingOnes(ShAmt);
    }
    bVar1 = uge((APInt *)Overflow,(ulong)uVar2);
    *(bool *)in_RCX = bVar1;
    AVar4 = shl(this,ShAmt);
    uVar3 = AVar4._8_8_;
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::sshl_ov(const APInt &ShAmt, bool &Overflow) const {
  Overflow = ShAmt.uge(getBitWidth());
  if (Overflow)
    return APInt(BitWidth, 0);

  if (isNonNegative()) // Don't allow sign change.
    Overflow = ShAmt.uge(countLeadingZeros());
  else
    Overflow = ShAmt.uge(countLeadingOnes());

  return *this << ShAmt;
}